

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

bstrList * bstrListCreate(void)

{
  bstrList *__ptr;
  bstring *pptVar1;
  
  __ptr = (bstrList *)malloc(0x10);
  if (__ptr != (bstrList *)0x0) {
    pptVar1 = (bstring *)malloc(8);
    __ptr->entry = pptVar1;
    if (pptVar1 != (bstring *)0x0) {
      __ptr->qty = 0;
      __ptr->mlen = 1;
      return __ptr;
    }
    free(__ptr);
  }
  return (bstrList *)0x0;
}

Assistant:

struct bstrList * bstrListCreate (void) {
struct bstrList * sl =
	(struct bstrList *) bstr__alloc (sizeof (struct bstrList));
	if (sl) {
		sl->entry = (bstring *) bstr__alloc (1*sizeof (bstring));
		if (!sl->entry) {
			bstr__free (sl);
			sl = NULL;
		} else {
			sl->qty = 0;
			sl->mlen = 1;
		}
	}
	return sl;
}